

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int SetCVar(AActor *activator,char *cvarname,int value,bool is_string)

{
  uint32 uVar1;
  int iVar2;
  FBaseCVar *this;
  FBaseCVar *cvar;
  bool is_string_local;
  int value_local;
  char *cvarname_local;
  AActor *activator_local;
  
  this = FindCVar(cvarname,(FBaseCVar **)0x0);
  if (((this == (FBaseCVar *)0x0) || (uVar1 = FBaseCVar::GetFlags(this), (uVar1 & 0x4008) != 0)) ||
     (uVar1 = FBaseCVar::GetFlags(this), (uVar1 & 0x2000) == 0)) {
    return 0;
  }
  uVar1 = FBaseCVar::GetFlags(this);
  if ((uVar1 & 2) == 0) {
    DoSetCVar(this,value,is_string,false);
    return 1;
  }
  if ((activator != (AActor *)0x0) && (activator->player != (player_t *)0x0)) {
    iVar2 = SetUserCVar((int)((long)(activator->player[-0xa3fb].weapons.Slots + 4) / 0x2a0),cvarname
                        ,value,is_string);
    return iVar2;
  }
  return 0;
}

Assistant:

static int SetCVar(AActor *activator, const char *cvarname, int value, bool is_string)
{
	FBaseCVar *cvar = FindCVar(cvarname, NULL);
	// Only mod-created cvars may be set.
	if (cvar == NULL || (cvar->GetFlags() & (CVAR_IGNORE|CVAR_NOSET)) || !(cvar->GetFlags() & CVAR_MOD))
	{
		return 0;
	}
	// For userinfo cvars, redirect to SetUserCVar
	if (cvar->GetFlags() & CVAR_USERINFO)
	{
		if (activator == NULL || activator->player == NULL)
		{
			return 0;
		}
		return SetUserCVar(int(activator->player - players), cvarname, value, is_string);
	}
	DoSetCVar(cvar, value, is_string);
	return 1;
}